

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O0

void phosg::parallel_range_blocks_thread_fn<unsigned_long>
               (function<bool_(unsigned_long,_unsigned_long)> *fn,
               atomic<unsigned_long> *current_value,atomic<unsigned_long> *result_value,
               unsigned_long end_value,unsigned_long block_size,size_t thread_num)

{
  bool bVar1;
  ulong uVar2;
  ulong local_78;
  unsigned_long z;
  unsigned_long block_end;
  unsigned_long block_start;
  size_t thread_num_local;
  unsigned_long block_size_local;
  unsigned_long end_value_local;
  atomic<unsigned_long> *result_value_local;
  atomic<unsigned_long> *current_value_local;
  function<bool_(unsigned_long,_unsigned_long)> *fn_local;
  
  do {
    LOCK();
    local_78 = (current_value->super___atomic_base<unsigned_long>)._M_i;
    (current_value->super___atomic_base<unsigned_long>)._M_i =
         (current_value->super___atomic_base<unsigned_long>)._M_i + block_size;
    UNLOCK();
    if (end_value <= local_78) {
      return;
    }
    uVar2 = local_78 + block_size;
    for (; local_78 < uVar2; local_78 = local_78 + 1) {
      bVar1 = ::std::function<bool_(unsigned_long,_unsigned_long)>::operator()
                        (fn,local_78,thread_num);
      if (bVar1) {
        ::std::__atomic_base<unsigned_long>::operator=
                  (&result_value->super___atomic_base<unsigned_long>,local_78);
        ::std::__atomic_base<unsigned_long>::operator=
                  (&current_value->super___atomic_base<unsigned_long>,end_value);
        break;
      }
    }
  } while( true );
}

Assistant:

void parallel_range_blocks_thread_fn(
    std::function<bool(IntT, size_t thread_num)>& fn,
    std::atomic<IntT>& current_value,
    std::atomic<IntT>& result_value,
    IntT end_value,
    IntT block_size,
    size_t thread_num) {
  IntT block_start;
  while ((block_start = current_value.fetch_add(block_size)) < end_value) {
    IntT block_end = block_start + block_size;
    for (IntT z = block_start; z < block_end; z++) {
      if (fn(z, thread_num)) {
        result_value = z;
        current_value = end_value;
        break;
      }
    }
  }
}